

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall
llvm::yaml::Input::Input
          (Input *this,StringRef InputContent,void *Ctxt,DiagHandlerTy DiagHandler,
          void *DiagHandlerCtxt)

{
  SmallVectorImpl<void_*> *pSVar1;
  SmallVectorImpl<std::pair<void_*,_unsigned_long>_> *pSVar2;
  Stream *this_00;
  error_category *peVar3;
  document_iterator dVar4;
  
  (this->super_IO).Ctxt = Ctxt;
  (this->super_IO)._vptr_IO = (_func_int **)&PTR__Input_01079980;
  (this->SrcMgr).Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SrcMgr).Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SrcMgr).Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SrcMgr).IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SrcMgr).IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SrcMgr).IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SrcMgr).DiagHandler = (DiagHandlerTy)0x0;
  (this->SrcMgr).DiagContext = (void *)0x0;
  this_00 = (Stream *)operator_new(0x10);
  yaml::Stream::Stream(this_00,InputContent,&this->SrcMgr,false,&this->EC);
  (this->Strm)._M_t.
  super___uniq_ptr_impl<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>._M_t.
  super__Tuple_impl<0UL,_llvm::yaml::Stream_*,_std::default_delete<llvm::yaml::Stream>_>.
  super__Head_base<0UL,_llvm::yaml::Stream_*,_false>._M_head_impl = this_00;
  (this->TopNode)._M_t.
  super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>.
  _M_t.
  super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
  .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl = (HNode *)0x0;
  (this->EC)._M_value = 0;
  peVar3 = (error_category *)std::_V2::system_category();
  (this->EC)._M_cat = peVar3;
  (this->StringAllocator).CurPtr = (char *)0x0;
  (this->StringAllocator).End = (char *)0x0;
  (this->StringAllocator).Slabs.super_SmallVectorImpl<void_*>.
  super_SmallVectorTemplateBase<void_*,_true>.super_SmallVectorTemplateCommon<void_*,_void>.
  super_SmallVectorBase.BeginX = &(this->StringAllocator).Slabs.super_SmallVectorStorage<void_*,_4U>
  ;
  pSVar1 = &(this->StringAllocator).Slabs.super_SmallVectorImpl<void_*>;
  (pSVar1->super_SmallVectorTemplateBase<void_*,_true>).
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<void_*,_true>).
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Capacity = 4;
  (this->StringAllocator).CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
  super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
  BeginX = &(this->StringAllocator).BytesAllocated;
  pSVar2 = &(this->StringAllocator).CustomSizedSlabs.
            super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>;
  (pSVar2->super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>).
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.Size
       = 0;
  (pSVar2->super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>).
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
  Capacity = 0;
  (this->StringAllocator).BytesAllocated = 0;
  (this->StringAllocator).RedZoneSize = 1;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->DocIterator).Doc =
       (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->CurrentNode = (HNode *)0x0;
  this->ScalarMatchFound = false;
  if (DiagHandler != (DiagHandlerTy)0x0) {
    (this->SrcMgr).DiagHandler = DiagHandler;
    (this->SrcMgr).DiagContext = DiagHandlerCtxt;
  }
  dVar4 = yaml::Stream::begin(this_00);
  (this->DocIterator).Doc = dVar4.Doc;
  return;
}

Assistant:

Input::Input(StringRef InputContent, void *Ctxt,
             SourceMgr::DiagHandlerTy DiagHandler, void *DiagHandlerCtxt)
    : IO(Ctxt), Strm(new Stream(InputContent, SrcMgr, false, &EC)) {
  if (DiagHandler)
    SrcMgr.setDiagHandler(DiagHandler, DiagHandlerCtxt);
  DocIterator = Strm->begin();
}